

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  size_t sVar4;
  unsigned_long *local_310;
  undefined8 *local_2f0;
  undefined8 *local_2d8;
  undefined8 *local_2b8;
  int *local_2a0;
  undefined4 *local_288;
  long *local_268;
  char local_244 [4];
  int len_1;
  char bf_1 [8];
  int len;
  void *p;
  char *bf;
  int sz;
  TValue *io_2;
  TValue num_2;
  TValue *io_1;
  TValue num_1;
  TValue *io;
  TValue num;
  char *pcStack_1d0;
  char c;
  char *s;
  char *e;
  BuffFS buff;
  __va_list_tag *argp_local;
  char *fmt_local;
  lua_State *L_local;
  
  buff.L._4_4_ = 0;
  buff.L._0_4_ = 0;
  e = (char *)L;
  buff.space._392_8_ = argp;
  argp_local = (__va_list_tag *)fmt;
  while (pcVar3 = strchr((char *)argp_local,0x25), pcVar3 != (char *)0x0) {
    addstr2buff((BuffFS *)&e,(char *)argp_local,(long)pcVar3 - (long)argp_local);
    switch(pcVar3[1]) {
    case '%':
      addstr2buff((BuffFS *)&e,"%",1);
      break;
    default:
      luaG_runerror(L,"invalid option \'%%%c\' to \'lua_pushfstring\'",(ulong)(uint)(int)pcVar3[1]);
    case 'I':
      num_2._8_8_ = &io_1;
      uVar1 = *(uint *)buff.space._392_8_;
      if (uVar1 < 0x29) {
        local_2b8 = (undefined8 *)((long)(int)uVar1 + *(long *)(buff.space._392_8_ + 0x10));
        *(uint *)buff.space._392_8_ = uVar1 + 8;
      }
      else {
        local_2b8 = *(undefined8 **)(buff.space._392_8_ + 8);
        *(undefined8 **)(buff.space._392_8_ + 8) = local_2b8 + 1;
      }
      io_1 = (TValue *)*local_2b8;
      num_1.value_.b._0_2_ = 0x13;
      addnum2buff((BuffFS *)&e,(TValue *)&io_1);
      break;
    case 'U':
      uVar1 = *(uint *)buff.space._392_8_;
      if (uVar1 < 0x29) {
        local_310 = (unsigned_long *)((long)(int)uVar1 + *(long *)(buff.space._392_8_ + 0x10));
        *(uint *)buff.space._392_8_ = uVar1 + 8;
      }
      else {
        local_310 = *(unsigned_long **)(buff.space._392_8_ + 8);
        *(unsigned_long **)(buff.space._392_8_ + 8) = local_310 + 1;
      }
      iVar2 = luaO_utf8esc(local_244,*local_310);
      addstr2buff((BuffFS *)&e,bf_1 + -(long)iVar2,(long)iVar2);
      break;
    case 'c':
      uVar1 = *(uint *)buff.space._392_8_;
      if (uVar1 < 0x29) {
        local_288 = (undefined4 *)((long)(int)uVar1 + *(long *)(buff.space._392_8_ + 0x10));
        *(uint *)buff.space._392_8_ = uVar1 + 8;
      }
      else {
        local_288 = *(undefined4 **)(buff.space._392_8_ + 8);
        *(undefined4 **)(buff.space._392_8_ + 8) = local_288 + 2;
      }
      num._15_1_ = SUB41(*local_288,0);
      addstr2buff((BuffFS *)&e,&num.field_0xf,1);
      break;
    case 'd':
      num_1._8_8_ = &io;
      uVar1 = *(uint *)buff.space._392_8_;
      if (uVar1 < 0x29) {
        local_2a0 = (int *)((long)(int)uVar1 + *(long *)(buff.space._392_8_ + 0x10));
        *(uint *)buff.space._392_8_ = uVar1 + 8;
      }
      else {
        local_2a0 = *(int **)(buff.space._392_8_ + 8);
        *(int **)(buff.space._392_8_ + 8) = local_2a0 + 2;
      }
      io = (TValue *)(long)*local_2a0;
      num.value_.b._0_2_ = 0x13;
      addnum2buff((BuffFS *)&e,(TValue *)&io);
      break;
    case 'f':
      uVar1 = *(uint *)(buff.space._392_8_ + 4);
      if (uVar1 < 0xa1) {
        local_2d8 = (undefined8 *)((long)(int)uVar1 + *(long *)(buff.space._392_8_ + 0x10));
        *(uint *)(buff.space._392_8_ + 4) = uVar1 + 0x10;
      }
      else {
        local_2d8 = *(undefined8 **)(buff.space._392_8_ + 8);
        *(undefined8 **)(buff.space._392_8_ + 8) = local_2d8 + 1;
      }
      io_2 = (TValue *)*local_2d8;
      num_2.value_.b._0_2_ = 3;
      addnum2buff((BuffFS *)&e,(TValue *)&io_2);
      break;
    case 'p':
      __s = getbuff((BuffFS *)&e,0x20);
      uVar1 = *(uint *)buff.space._392_8_;
      if (uVar1 < 0x29) {
        local_2f0 = (undefined8 *)((long)(int)uVar1 + *(long *)(buff.space._392_8_ + 0x10));
        *(uint *)buff.space._392_8_ = uVar1 + 8;
      }
      else {
        local_2f0 = *(undefined8 **)(buff.space._392_8_ + 8);
        *(undefined8 **)(buff.space._392_8_ + 8) = local_2f0 + 1;
      }
      unique0x00012000 = *local_2f0;
      memset(__s,0xab,0x20);
      bf_1._0_4_ = snprintf(__s,0x20,"%p",stack0xfffffffffffffdc8);
      buff.L._4_4_ = bf_1._0_4_ + buff.L._4_4_;
      break;
    case 's':
      uVar1 = *(uint *)buff.space._392_8_;
      if (uVar1 < 0x29) {
        local_268 = (long *)((long)(int)uVar1 + *(long *)(buff.space._392_8_ + 0x10));
        *(uint *)buff.space._392_8_ = uVar1 + 8;
      }
      else {
        local_268 = *(long **)(buff.space._392_8_ + 8);
        *(long **)(buff.space._392_8_ + 8) = local_268 + 1;
      }
      pcStack_1d0 = (char *)*local_268;
      if (pcStack_1d0 == (char *)0x0) {
        pcStack_1d0 = "(null)";
      }
      sVar4 = strlen(pcStack_1d0);
      addstr2buff((BuffFS *)&e,pcStack_1d0,sVar4);
    }
    argp_local = (__va_list_tag *)(pcVar3 + 2);
  }
  sVar4 = strlen((char *)argp_local);
  addstr2buff((BuffFS *)&e,(char *)argp_local,sVar4);
  clearbuff((BuffFS *)&e);
  if (1 < (int)buff.L) {
    luaV_concat(L,(int)buff.L);
  }
  if ((L->top[-1].tt_ & 0xf) == 4) {
    if (((L->top[-1].value_.gc)->tt & 0xf) == 4) {
      return (char *)(L->top[-1].value_.f + 0x18);
    }
    __assert_fail("(((((L->top - 1)->value_).gc)->tt) & 0x0F) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                  ,0x22c,
                  "const char *luaO_pushvfstring(lua_State *, const char *, struct __va_list_tag *)"
                 );
  }
  __assert_fail("(((((((L->top - 1))->tt_)) & 0x0F)) == (4))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                ,0x22c,
                "const char *luaO_pushvfstring(lua_State *, const char *, struct __va_list_tag *)");
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  BuffFS buff;  /* holds last part of the result */
  const char *e;  /* points to next '%' */
  buff.pushed = buff.blen = 0;
  buff.L = L;
  while ((e = strchr(fmt, '%')) != NULL) {
    addstr2buff(&buff, fmt, e - fmt);  /* add 'fmt' up to '%' */
    switch (*(e + 1)) {  /* conversion specifier */
      case 's': {  /* zero-terminated string */
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        addstr2buff(&buff, s, strlen(s));
        break;
      }
      case 'c': {  /* an 'int' as a character */
        char c = cast_uchar(va_arg(argp, int));
        addstr2buff(&buff, &c, sizeof(char));
        break;
      }
      case 'd': {  /* an 'int' */
        TValue num;
        setivalue(&num, va_arg(argp, int));
        addnum2buff(&buff, &num);
        break;
      }
      case 'I': {  /* a 'lua_Integer' */
        TValue num;
        setivalue(&num, cast(lua_Integer, va_arg(argp, l_uacInt)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'f': {  /* a 'lua_Number' */
        TValue num;
        setfltvalue(&num, cast_num(va_arg(argp, l_uacNumber)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'p': {  /* a pointer */
        const int sz = 3 * sizeof(void*) + 8; /* enough space for '%p' */
        char *bf = getbuff(&buff, sz);
        void *p = va_arg(argp, void *);
        int len = lua_pointer2str(bf, sz, p);
        addsize(&buff, len);
        break;
      }
      case 'U': {  /* a 'long' as a UTF-8 sequence */
        char bf[UTF8BUFFSZ];
        int len = luaO_utf8esc(bf, va_arg(argp, long));
        addstr2buff(&buff, bf + UTF8BUFFSZ - len, len);
        break;
      }
      case '%': {
        addstr2buff(&buff, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                         *(e + 1));
      }
    }
    fmt = e + 2;  /* skip '%' and the specifier */
  }
  addstr2buff(&buff, fmt, strlen(fmt));  /* rest of 'fmt' */
  clearbuff(&buff);  /* empty buffer into the stack */
  if (buff.pushed > 1)
    luaV_concat(L, buff.pushed);  /* join all partial results */
  return svalue(L->top - 1);
}